

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyLoader.cpp
# Opt level: O1

void __thiscall
Assimp::PLYImporter::LoadFace
          (PLYImporter *this,Element *pcElement,ElementInstance *instElement,uint pos)

{
  aiFace *paVar1;
  aiMesh *paVar2;
  pointer pPVar3;
  pointer pPVar4;
  long lVar5;
  ulong *puVar6;
  aiFace *paVar7;
  uint *puVar8;
  aiVector3D *__s;
  runtime_error *prVar9;
  pointer pPVar10;
  bool bVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  int iVar15;
  EDataType EVar16;
  EDataType EVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  bool bVar22;
  int iVar23;
  pointer pVVar24;
  float fVar25;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  ulong local_40;
  aiMesh *local_38;
  
  if (pcElement == (Element *)0x0) {
    __assert_fail("nullptr != pcElement",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Ply/PlyLoader.cpp"
                  ,0x1fe,
                  "void Assimp::PLYImporter::LoadFace(const PLY::Element *, const PLY::ElementInstance *, unsigned int)"
                 );
  }
  if (instElement == (ElementInstance *)0x0) {
    __assert_fail("nullptr != instElement",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Ply/PlyLoader.cpp"
                  ,0x1ff,
                  "void Assimp::PLYImporter::LoadFace(const PLY::Element *, const PLY::ElementInstance *, unsigned int)"
                 );
  }
  paVar2 = this->mGeneratedMesh;
  if (paVar2 == (aiMesh *)0x0) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_60[0] = local_50;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_60,"Invalid .ply file: Vertices should be declared before faces","");
    std::runtime_error::runtime_error(prVar9,(string *)local_60);
    *(undefined ***)prVar9 = &PTR__runtime_error_00900168;
    __cxa_throw(prVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (pcElement->eSemantic == EEST_TriStrip) {
    pPVar10 = (pcElement->alProperties).
              super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pPVar3 = (pcElement->alProperties).
             super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    iVar23 = -1;
    EVar17 = EDT_Char;
    if (pPVar10 != pPVar3) {
      iVar18 = 0;
      do {
        if (pPVar10->bIsList == true) {
          EVar16 = pPVar10->eType;
          bVar22 = true;
          bVar11 = bVar22;
          goto LAB_00480d7c;
        }
        pPVar10 = pPVar10 + 1;
        iVar18 = iVar18 + 1;
      } while (pPVar10 != pPVar3);
    }
    EVar16 = EDT_Char;
    iVar18 = -1;
    bVar22 = false;
    bVar11 = bVar22;
  }
  else {
    iVar23 = -1;
    if (pcElement->eSemantic == EEST_Face) {
      pPVar10 = (pcElement->alProperties).
                super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pPVar3 = (pcElement->alProperties).
               super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pPVar10 != pPVar3) {
        bVar11 = false;
        iVar18 = -1;
        EVar16 = EDT_Char;
        EVar17 = EDT_Char;
        iVar15 = 0;
        do {
          if (pPVar10->Semantic == EST_TextureCoordinates) {
            if (pPVar10->bIsList == true) {
              EVar17 = pPVar10->eType;
              bVar11 = true;
              iVar23 = iVar15;
            }
          }
          else if ((pPVar10->Semantic == EST_VertexIndex) && (pPVar10->bIsList == true)) {
            EVar16 = pPVar10->eType;
            bVar11 = true;
            iVar18 = iVar15;
          }
          pPVar10 = pPVar10 + 1;
          iVar15 = iVar15 + 1;
        } while (pPVar10 != pPVar3);
        bVar22 = false;
        goto LAB_00480d7c;
      }
    }
    EVar17 = EDT_Char;
    bVar22 = false;
    EVar16 = EDT_Char;
    iVar18 = -1;
    bVar11 = false;
  }
LAB_00480d7c:
  if (bVar11) {
    if (paVar2->mFaces == (aiFace *)0x0) {
      paVar2->mNumFaces = pcElement->NumOccur;
      paVar2 = this->mGeneratedMesh;
      uVar12 = (ulong)paVar2->mNumFaces;
      puVar6 = (ulong *)operator_new__(uVar12 * 0x10 + 8);
      paVar1 = (aiFace *)(puVar6 + 1);
      *puVar6 = uVar12;
      if (uVar12 != 0) {
        paVar7 = paVar1;
        do {
          paVar7->mNumIndices = 0;
          paVar7->mIndices = (uint *)0x0;
          paVar7 = paVar7 + 1;
        } while (paVar7 != paVar1 + uVar12);
      }
      paVar2->mFaces = paVar1;
    }
    if (bVar22) {
      uVar13 = (ulong)iVar18;
      pPVar4 = (instElement->alProperties).
               super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = ((long)(instElement->alProperties).
                      super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 >> 3) *
               -0x5555555555555555;
      if (uVar12 < uVar13 || uVar12 - uVar13 == 0) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_60[0] = local_50;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_60,"Invalid .ply file: Property index is out of range.","");
        std::runtime_error::runtime_error(prVar9,(string *)local_60);
        *(undefined ***)prVar9 = &PTR__runtime_error_00900168;
        __cxa_throw(prVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      pVVar24 = *(pointer *)
                 &pPVar4[uVar13].avList.
                  super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
      ;
      if (pVVar24 !=
          *(pointer *)
           ((long)&pPVar4[uVar13].avList.
                   super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
           + 8)) {
        uVar20 = 0xffffffff;
        bVar22 = false;
        uVar19 = 0xffffffff;
        do {
          if (EVar16 < EDT_INVALID) {
            (*(code *)(&DAT_00788120 + *(int *)(&DAT_00788120 + (ulong)EVar16 * 4)))();
            return;
          }
          if (uVar20 == 0xffffffff) {
            uVar20 = 0;
          }
          else if (uVar19 == 0xffffffff) {
            uVar19 = 0;
          }
          else {
            if (this->mGeneratedMesh->mFaces == (aiFace *)0x0) {
              this->mGeneratedMesh->mNumFaces = pcElement->NumOccur;
              local_38 = this->mGeneratedMesh;
              uVar12 = (ulong)local_38->mNumFaces;
              local_40 = uVar12;
              puVar6 = (ulong *)operator_new__(uVar12 * 0x10 + 8);
              paVar1 = (aiFace *)(puVar6 + 1);
              *puVar6 = local_40;
              if (local_40 != 0) {
                paVar7 = paVar1;
                do {
                  paVar7->mNumIndices = 0;
                  paVar7->mIndices = (uint *)0x0;
                  paVar7 = paVar7 + 1;
                } while (paVar7 != paVar1 + uVar12);
              }
              local_38->mFaces = paVar1;
            }
            this->mGeneratedMesh->mFaces[pos].mNumIndices = 3;
            puVar8 = (uint *)operator_new__(0xc);
            this->mGeneratedMesh->mFaces[pos].mIndices = puVar8;
            *this->mGeneratedMesh->mFaces[pos].mIndices = uVar20;
            this->mGeneratedMesh->mFaces[pos].mIndices[1] = uVar19;
            this->mGeneratedMesh->mFaces[pos].mIndices[2] = 0;
            if (!bVar22) {
              puVar8 = this->mGeneratedMesh->mFaces[pos].mIndices;
              uVar20 = *puVar8;
              *puVar8 = puVar8[1];
              puVar8[1] = uVar20;
            }
            uVar20 = uVar19;
            uVar19 = 0;
            bVar22 = (bool)(bVar22 ^ 1);
          }
          pVVar24 = pVVar24 + 1;
        } while (pVVar24 !=
                 *(pointer *)
                  ((long)&pPVar4[uVar13].avList.
                          super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                  + 8));
      }
    }
    else {
      if (iVar18 != -1) {
        uVar13 = (ulong)iVar18;
        pPVar4 = (instElement->alProperties).
                 super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar12 = ((long)(instElement->alProperties).
                        super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 >> 3) *
                 -0x5555555555555555;
        if (uVar12 < uVar13 || uVar12 - uVar13 == 0) {
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_60[0] = local_50;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_60,"Invalid .ply file: Property index is out of range.","");
          std::runtime_error::runtime_error(prVar9,(string *)local_60);
          *(undefined ***)prVar9 = &PTR__runtime_error_00900168;
          __cxa_throw(prVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar12 = (long)*(pointer *)
                        ((long)&pPVar4[uVar13].avList.
                                super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                        + 8) -
                 *(long *)&pPVar4[uVar13].avList.
                           super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
        ;
        uVar21 = uVar12 >> 3;
        uVar20 = (uint)uVar21;
        this->mGeneratedMesh->mFaces[pos].mNumIndices = uVar20;
        puVar8 = (uint *)operator_new__(uVar12 >> 1 & 0x3fffffffc);
        this->mGeneratedMesh->mFaces[pos].mIndices = puVar8;
        pPVar4 = (instElement->alProperties).
                 super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar12 = ((long)(instElement->alProperties).
                        super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 >> 3) *
                 -0x5555555555555555;
        if (uVar12 < uVar13 || uVar12 - uVar13 == 0) {
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_60[0] = local_50;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_60,"Invalid .ply file: Property index is out of range.","");
          std::runtime_error::runtime_error(prVar9,(string *)local_60);
          *(undefined ***)prVar9 = &PTR__runtime_error_00900168;
          __cxa_throw(prVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        if (uVar20 != 0) {
          lVar5 = *(long *)&pPVar4[uVar13].avList.
                            super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
          ;
          uVar12 = 0;
          do {
            dVar14 = 0.0;
            if (EVar16 < EDT_INVALID) {
              dVar14 = *(double *)(lVar5 + uVar12 * 8);
              switch(EVar16) {
              case EDT_Float:
                dVar14 = (double)(long)SUB84(dVar14,0);
                break;
              case EDT_Double:
                dVar14 = (double)(long)dVar14;
              }
            }
            this->mGeneratedMesh->mFaces[pos].mIndices[uVar12] = SUB84(dVar14,0);
            uVar12 = uVar12 + 1;
          } while ((uVar21 & 0xffffffff) != uVar12);
        }
      }
      if (iVar23 != -1) {
        uVar13 = (ulong)iVar23;
        pPVar4 = (instElement->alProperties).
                 super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar12 = ((long)(instElement->alProperties).
                        super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 >> 3) *
                 -0x5555555555555555;
        if (uVar12 < uVar13 || uVar12 - uVar13 == 0) {
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_60[0] = local_50;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_60,"Invalid .ply file: Property index is out of range.","");
          std::runtime_error::runtime_error(prVar9,(string *)local_60);
          *(undefined ***)prVar9 = &PTR__runtime_error_00900168;
          __cxa_throw(prVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        lVar5 = *(long *)&pPVar4[uVar13].avList.
                          super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
        ;
        iVar23 = (int)((ulong)((long)*(pointer *)
                                      ((long)&pPVar4[uVar13].avList.
                                              super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                                      + 8) - lVar5) >> 3);
        if (iVar23 - 6U < 3) {
          uVar12 = 0;
          do {
            paVar2 = this->mGeneratedMesh;
            uVar20 = paVar2->mFaces[pos].mIndices[uVar12 >> 1 & 0x7fffffff];
            if (uVar20 < paVar2->mNumVertices) {
              if (paVar2->mTextureCoords[0] == (aiVector3D *)0x0) {
                paVar2->mNumUVComponents[0] = 2;
                paVar2 = this->mGeneratedMesh;
                uVar19 = paVar2->mNumVertices;
                __s = (aiVector3D *)operator_new__((ulong)uVar19 * 0xc);
                if (uVar19 != 0) {
                  memset(__s,0,(((ulong)uVar19 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
                }
                paVar2->mTextureCoords[0] = __s;
              }
              dVar14 = *(double *)(lVar5 + uVar12 * 8);
              fVar25 = SUB84(dVar14,0);
              if ((uVar12 & 1) == 0) {
                switch(EVar17) {
                case EDT_Char:
                case EDT_Short:
                case EDT_Int:
                  fVar25 = (float)(int)fVar25;
                  break;
                case EDT_UChar:
                case EDT_UShort:
                case EDT_UInt:
                  fVar25 = (float)((ulong)dVar14 & 0xffffffff);
                  break;
                case EDT_Float:
                  break;
                case EDT_Double:
                  fVar25 = (float)dVar14;
                  break;
                default:
                  fVar25 = 0.0;
                }
                this->mGeneratedMesh->mTextureCoords[0][uVar20].x = fVar25;
              }
              else {
                switch(EVar17) {
                case EDT_Char:
                case EDT_Short:
                case EDT_Int:
                  fVar25 = (float)(int)fVar25;
                  break;
                case EDT_UChar:
                case EDT_UShort:
                case EDT_UInt:
                  fVar25 = (float)((ulong)dVar14 & 0xffffffff);
                  break;
                case EDT_Float:
                  break;
                case EDT_Double:
                  fVar25 = (float)dVar14;
                  break;
                default:
                  fVar25 = 0.0;
                }
                this->mGeneratedMesh->mTextureCoords[0][uVar20].y = fVar25;
              }
              this->mGeneratedMesh->mTextureCoords[0][uVar20].z = 0.0;
            }
            uVar12 = uVar12 + 1;
          } while (iVar23 != (int)uVar12);
        }
      }
    }
  }
  return;
}

Assistant:

void PLYImporter::LoadFace(const PLY::Element* pcElement, const PLY::ElementInstance* instElement,
        unsigned int pos) {
    ai_assert(nullptr != pcElement);
    ai_assert(nullptr != instElement);

    if (mGeneratedMesh == nullptr) {
        throw DeadlyImportError("Invalid .ply file: Vertices should be declared before faces");
    }

    bool bOne = false;

    // index of the vertex index list
    unsigned int iProperty = 0xFFFFFFFF;
    PLY::EDataType eType = EDT_Char;
    bool bIsTriStrip = false;

    // index of the material index property
    //unsigned int iMaterialIndex = 0xFFFFFFFF;
    //PLY::EDataType eType2 = EDT_Char;

    // texture coordinates
    unsigned int iTextureCoord = 0xFFFFFFFF;
    PLY::EDataType eType3 = EDT_Char;

    // face = unique number of vertex indices
    if (PLY::EEST_Face == pcElement->eSemantic) {
        unsigned int _a = 0;
        for (std::vector<PLY::Property>::const_iterator a = pcElement->alProperties.begin();
                a != pcElement->alProperties.end(); ++a, ++_a) {
            if (PLY::EST_VertexIndex == (*a).Semantic) {
                // must be a dynamic list!
                if (!(*a).bIsList) {
                    continue;
                }

                iProperty = _a;
                bOne = true;
                eType = (*a).eType;
            } else if (PLY::EST_TextureCoordinates == (*a).Semantic) {
                // must be a dynamic list!
                if (!(*a).bIsList) {
                    continue;
                }
                iTextureCoord = _a;
                bOne = true;
                eType3 = (*a).eType;
            }
        }
    }
    // triangle strip
    // TODO: triangle strip and material index support???
    else if (PLY::EEST_TriStrip == pcElement->eSemantic) {
        unsigned int _a = 0;
        for (std::vector<PLY::Property>::const_iterator a = pcElement->alProperties.begin();
                a != pcElement->alProperties.end(); ++a, ++_a) {
            // must be a dynamic list!
            if (!(*a).bIsList) {
                continue;
            }
            iProperty = _a;
            bOne = true;
            bIsTriStrip = true;
            eType = (*a).eType;
            break;
        }
    }

    // check whether we have at least one per-face information set
    if (bOne) {
        if (mGeneratedMesh->mFaces == nullptr) {
            mGeneratedMesh->mNumFaces = pcElement->NumOccur;
            mGeneratedMesh->mFaces = new aiFace[mGeneratedMesh->mNumFaces];
        }

        if (!bIsTriStrip) {
            // parse the list of vertex indices
            if (0xFFFFFFFF != iProperty) {
                const unsigned int iNum = (unsigned int)GetProperty(instElement->alProperties, iProperty).avList.size();
                mGeneratedMesh->mFaces[pos].mNumIndices = iNum;
                mGeneratedMesh->mFaces[pos].mIndices = new unsigned int[iNum];

                std::vector<PLY::PropertyInstance::ValueUnion>::const_iterator p =
                GetProperty(instElement->alProperties, iProperty).avList.begin();

                for (unsigned int a = 0; a < iNum; ++a, ++p) {
                    mGeneratedMesh->mFaces[pos].mIndices[a] = PLY::PropertyInstance::ConvertTo<unsigned int>(*p, eType);
                }
            }

        // parse the material index
        // cannot be handled without processing the whole file first
        /*if (0xFFFFFFFF != iMaterialIndex)
        {
            mGeneratedMesh->mFaces[pos]. = PLY::PropertyInstance::ConvertTo<unsigned int>(
            GetProperty(instElement->alProperties, iMaterialIndex).avList.front(), eType2);
        }*/

            if (0xFFFFFFFF != iTextureCoord) {
                const unsigned int iNum = (unsigned int)GetProperty(instElement->alProperties, iTextureCoord).avList.size();

                //should be 6 coords
                std::vector<PLY::PropertyInstance::ValueUnion>::const_iterator p =
                GetProperty(instElement->alProperties, iTextureCoord).avList.begin();

                if ((iNum / 3) == 2) // X Y coord
                {
                    for (unsigned int a = 0; a < iNum; ++a, ++p) {
                        unsigned int vindex = mGeneratedMesh->mFaces[pos].mIndices[a / 2];
                        if (vindex < mGeneratedMesh->mNumVertices) {
                            if (mGeneratedMesh->mTextureCoords[0] == nullptr ) {
                                mGeneratedMesh->mNumUVComponents[0] = 2;
                                mGeneratedMesh->mTextureCoords[0] = new aiVector3D[mGeneratedMesh->mNumVertices];
                            }

                            if (a % 2 == 0) {
                                mGeneratedMesh->mTextureCoords[0][vindex].x = PLY::PropertyInstance::ConvertTo<ai_real>(*p, eType3);
                            } else {
                                mGeneratedMesh->mTextureCoords[0][vindex].y = PLY::PropertyInstance::ConvertTo<ai_real>(*p, eType3);
                            }

                            mGeneratedMesh->mTextureCoords[0][vindex].z = 0;
                        }
                    }
                }
            }
        } else { // triangle strips
            // normally we have only one triangle strip instance where
            // a value of -1 indicates a restart of the strip
            bool flip = false;
            const std::vector<PLY::PropertyInstance::ValueUnion>& quak = GetProperty(instElement->alProperties, iProperty).avList;
            //pvOut->reserve(pvOut->size() + quak.size() + (quak.size()>>2u)); //Limits memory consumption

            int aiTable[2] = { -1, -1 };
            for (std::vector<PLY::PropertyInstance::ValueUnion>::const_iterator a = quak.begin(); a != quak.end(); ++a)  {
                const int p = PLY::PropertyInstance::ConvertTo<int>(*a, eType);

                if (-1 == p) {
                    // restart the strip ...
                    aiTable[0] = aiTable[1] = -1;
                    flip = false;
                    continue;
                }
                if (-1 == aiTable[0]) {
                    aiTable[0] = p;
                    continue;
                }
                if (-1 == aiTable[1]) {
                    aiTable[1] = p;
                    continue;
                }

                if (mGeneratedMesh->mFaces == nullptr) {
                    mGeneratedMesh->mNumFaces = pcElement->NumOccur;
                    mGeneratedMesh->mFaces = new aiFace[mGeneratedMesh->mNumFaces];
                }

                mGeneratedMesh->mFaces[pos].mNumIndices = 3;
                mGeneratedMesh->mFaces[pos].mIndices = new unsigned int[3];
                mGeneratedMesh->mFaces[pos].mIndices[0] = aiTable[0];
                mGeneratedMesh->mFaces[pos].mIndices[1] = aiTable[1];
                mGeneratedMesh->mFaces[pos].mIndices[2] = p;

                // every second pass swap the indices.
                flip = !flip;
                if ( flip ) {
                    std::swap(mGeneratedMesh->mFaces[pos].mIndices[0], mGeneratedMesh->mFaces[pos].mIndices[1]);
                }

                aiTable[0] = aiTable[1];
                aiTable[1] = p;
            }
        }
    }
}